

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_symbol_styled(nk_context *ctx,nk_style_button *style,nk_symbol_type symbol)

{
  nk_rect bounds_00;
  nk_widget_layout_states nVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  nk_user_font *unaff_retaddr;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  float local_58;
  nk_symbol_type nStack_54;
  nk_input *in_stack_ffffffffffffffb8;
  nk_style_button *in_stack_ffffffffffffffc0;
  nk_context *ctx_00;
  nk_rect *bounds_01;
  float fVar2;
  nk_symbol_type nStack_c;
  nk_bool local_4;
  
  fVar2 = (float)in_RDI;
  nStack_c = (nk_symbol_type)((ulong)in_RDI >> 0x20);
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    bounds_01 = *(nk_rect **)(in_RDI + 0x40d8);
    ctx_00 = *(nk_context **)&bounds_01[10].w;
    nVar1 = nk_widget(bounds_01,ctx_00);
    if (nVar1 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      if ((nVar1 == NK_WIDGET_ROM) || (((ctx_00->input).keyboard.keys[0].clicked & 0x1000) != 0)) {
        local_58 = 0.0;
        nStack_54 = NK_SYMBOL_NONE;
      }
      else {
        nStack_54 = nStack_c;
        local_58 = fVar2;
      }
      bounds_00.y = (float)(int)in_RSI;
      bounds_00.w = (float)(int)((ulong)in_RSI >> 0x20);
      bounds_00.x = (float)in_EDX;
      bounds_00.h = fVar2;
      local_4 = nk_do_button_symbol((nk_flags *)bounds_01,(nk_command_buffer *)ctx_00,bounds_00,
                                    nStack_54,(nk_button_behavior)local_58,in_stack_ffffffffffffffc0
                                    ,in_stack_ffffffffffffffb8,unaff_retaddr);
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_button_symbol_styled(struct nk_context *ctx,
const struct nk_style_button *style, enum nk_symbol_type symbol)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
layout = win->layout;
state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_symbol(&ctx->last_widget_state, &win->buffer, bounds,
symbol, ctx->button_behavior, style, in, ctx->style.font);
}